

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O2

FT_UInt32 tt_cmap8_char_next(TT_CMap cmap,FT_UInt32 *pchar_code)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  FT_UInt32 FVar7;
  byte *pbVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  FT_UInt32 FVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  bool bVar20;
  
  if (*pchar_code == 0xffffffff) {
    FVar13 = 0;
  }
  else {
    uVar9 = *(uint *)(cmap->data + 0x200c);
    uVar14 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
    uVar9 = *pchar_code + 1;
    pbVar8 = cmap->data + 0x2010;
    while (bVar20 = uVar14 != 0, uVar14 = uVar14 - 1, bVar20) {
      uVar6 = (uint)*pbVar8;
      uVar3 = (uint)pbVar8[1];
      uVar4 = (uint)pbVar8[2];
      uVar2 = *(uint *)(pbVar8 + 4);
      iVar19 = (uint)pbVar8[8] * 0x1000000;
      iVar16 = (uint)pbVar8[9] * 0x10000;
      uVar17 = (uint)pbVar8[10] * 0x100;
      bVar1 = pbVar8[0xb];
      uVar15 = (uint)pbVar8[3];
      uVar12 = uVar6 * 0x1000000 + uVar3 * 0x10000 | uVar4 * 0x100 | uVar15;
      uVar5 = uVar12;
      if (uVar12 < uVar9) {
        uVar5 = uVar9;
      }
      uVar10 = ~uVar5 + uVar12;
      iVar11 = iVar19 + iVar16 + uVar17 + (uint)bVar1;
      iVar18 = 0;
      while( true ) {
        if (((uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) <
             uVar5 + iVar18) || (uVar10 < (iVar16 + iVar19 | uVar17 | (uint)bVar1)))
        goto LAB_00203315;
        if (((uVar5 + iVar11) - (uint)pbVar8[3]) + uVar4 * -0x100 + uVar3 * -0x10000 +
            uVar6 * -0x1000000 + iVar18 != 0) break;
        if (uVar5 + iVar18 == 0xffffffff) goto LAB_0020333f;
        iVar18 = iVar18 + 1;
        uVar10 = uVar10 - 1;
      }
      if (((uVar5 + iVar19 + iVar16 + uVar17 + (uint)bVar1) - uVar15) + uVar4 * -0x100 +
          uVar3 * -0x10000 + uVar6 * -0x1000000 + iVar18 <
          (uint)((cmap->cmap).charmap.face)->num_glyphs) {
        if (uVar12 < uVar9) {
          uVar12 = uVar9;
        }
        FVar7 = uVar12 + iVar18;
        FVar13 = ((uVar12 + iVar11) - uVar15) + uVar4 * -0x100 + uVar3 * -0x10000 +
                 uVar6 * -0x1000000 + iVar18;
        goto LAB_00203343;
      }
LAB_00203315:
      uVar15 = uVar6 * 0x1000000 + uVar3 * 0x10000 + uVar4 * 0x100 + uVar15;
      if (uVar15 < uVar9) {
        uVar15 = uVar9;
      }
      uVar9 = uVar15 + iVar18;
      pbVar8 = pbVar8 + 0xc;
    }
LAB_0020333f:
    FVar13 = 0;
    FVar7 = 0;
LAB_00203343:
    *pchar_code = FVar7;
  }
  return FVar13;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt32 )
  tt_cmap8_char_next( TT_CMap     cmap,
                      FT_UInt32  *pchar_code )
  {
    FT_Face    face       = cmap->cmap.charmap.face;
    FT_UInt32  result     = 0;
    FT_UInt32  char_code;
    FT_UInt    gindex     = 0;
    FT_Byte*   table      = cmap->data;
    FT_Byte*   p          = table + 8204;
    FT_UInt32  num_groups = TT_NEXT_ULONG( p );
    FT_UInt32  start, end, start_id;


    if ( *pchar_code >= 0xFFFFFFFFUL )
      return 0;

    char_code = *pchar_code + 1;

    p = table + 8208;

    for ( ; num_groups > 0; num_groups-- )
    {
      start    = TT_NEXT_ULONG( p );
      end      = TT_NEXT_ULONG( p );
      start_id = TT_NEXT_ULONG( p );

      if ( char_code < start )
        char_code = start;

    Again:
      if ( char_code <= end )
      {
        /* ignore invalid group */
        if ( start_id > 0xFFFFFFFFUL - ( char_code - start ) )
          continue;

        gindex = (FT_UInt)( start_id + ( char_code - start ) );

        /* does first element of group point to `.notdef' glyph? */
        if ( gindex == 0 )
        {
          if ( char_code >= 0xFFFFFFFFUL )
            break;

          char_code++;
          goto Again;
        }

        /* if `gindex' is invalid, the remaining values */
        /* in this group are invalid, too               */
        if ( gindex >= (FT_UInt)face->num_glyphs )
        {
          gindex = 0;
          continue;
        }

        result = char_code;
        break;
      }
    }

    *pchar_code = result;
    return gindex;
  }